

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widget.cpp
# Opt level: O0

void __thiscall polyscope::Widget::~Widget(Widget *this)

{
  bool bVar1;
  iterator __position;
  undefined8 *in_RDI;
  iterator pos;
  set<polyscope::Widget_*,_std::less<polyscope::Widget_*>,_std::allocator<polyscope::Widget_*>_>
  *in_stack_ffffffffffffffb8;
  set<polyscope::Widget_*,_std::less<polyscope::Widget_*>,_std::allocator<polyscope::Widget_*>_>
  *in_stack_ffffffffffffffc0;
  set<polyscope::Widget_*,_std::less<polyscope::Widget_*>,_std::allocator<polyscope::Widget_*>_>
  *in_stack_ffffffffffffffc8;
  _Self local_20 [2];
  _Self local_10 [2];
  
  *in_RDI = &PTR_draw_00794828;
  __position = std::
               set<polyscope::Widget_*,_std::less<polyscope::Widget_*>,_std::allocator<polyscope::Widget_*>_>
               ::find(in_stack_ffffffffffffffc8,(key_type *)in_stack_ffffffffffffffc0);
  local_10[0]._M_node = __position._M_node;
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       set<polyscope::Widget_*,_std::less<polyscope::Widget_*>,_std::allocator<polyscope::Widget_*>_>
       ::end(in_stack_ffffffffffffffb8);
  bVar1 = std::operator==(local_10,local_20);
  if (!bVar1) {
    std::set<polyscope::Widget*,std::less<polyscope::Widget*>,std::allocator<polyscope::Widget*>>::
    erase_abi_cxx11_(in_stack_ffffffffffffffc0,(const_iterator)__position._M_node);
  }
  return;
}

Assistant:

Widget::~Widget() {
  auto pos = state::widgets.find(this);
  if (pos == state::widgets.end()) return;
  state::widgets.erase(pos);
}